

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

string * GetPublicIPv4_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  long lVar3;
  string *in_RDI;
  string readBuf;
  long httpResponse;
  char curl_errtxt [256];
  
  paVar1 = &readBuf.field_2;
  readBuf._M_string_length = 0;
  readBuf.field_2._M_local_buf[0] = '\0';
  readBuf._M_dataplus._M_p = (pointer)paVar1;
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x2ac,"GetPublicIPv4",logERR,"Could not initialize easy CURL");
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"",(allocator<char> *)&httpResponse);
    goto LAB_0013f717;
  }
  std::__cxx11::string::reserve((ulong)&readBuf);
  curl_easy_setopt(lVar3,99,1);
  curl_easy_setopt(lVar3,0xd,5);
  curl_easy_setopt(lVar3,0x271a,curl_errtxt);
  curl_easy_setopt(lVar3,0x4e2b,CBReadToStringBuf);
  curl_easy_setopt(lVar3,0x2711,&readBuf);
  curl_easy_setopt(lVar3,0x2722,HTTP_USER_AGENT);
  curl_easy_setopt(lVar3,0x2712,"https://api.ipify.org/");
  curl_easy_setopt(lVar3,0xd8,2);
  uVar2 = curl_easy_perform(lVar3);
  if (uVar2 == 0) {
    httpResponse = 0;
    curl_easy_getinfo(lVar3,0x200002);
    if (httpResponse != 200) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
               ,0x2c3,"GetPublicIPv4",logERR,"HTPP response was not OK but %d");
      }
      goto LAB_0013f6c2;
    }
  }
  else {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x2c8,"GetPublicIPv4",logERR,"CURL call failed (%d)",(ulong)uVar2);
    }
LAB_0013f6c2:
    readBuf._M_string_length = 0;
    *readBuf._M_dataplus._M_p = '\0';
  }
  curl_easy_cleanup(lVar3);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)readBuf._M_dataplus._M_p == paVar1) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(readBuf.field_2._M_allocated_capacity._1_7_,readBuf.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = readBuf.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = readBuf._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(readBuf.field_2._M_allocated_capacity._1_7_,readBuf.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = readBuf._M_string_length;
  readBuf._M_string_length = 0;
  readBuf.field_2._M_local_buf[0] = '\0';
  readBuf._M_dataplus._M_p = (pointer)paVar1;
LAB_0013f717:
  std::__cxx11::string::~string((string *)&readBuf);
  return in_RDI;
}

Assistant:

std::string GetPublicIPv4 ()
{
    char curl_errtxt[CURL_ERROR_SIZE];
    std::string readBuf;
    
    // initialize the CURL handle
    CURL *pCurl = curl_easy_init();
    if (!pCurl) {
        LOG_MSG(logERR,ERR_CURL_EASY_INIT);
        return "";
    }

    // Setup buffer and CURL handle
    readBuf.reserve(CURL_MAX_WRITE_SIZE);
    curl_easy_setopt(pCurl, CURLOPT_NOSIGNAL, 1);
    curl_easy_setopt(pCurl, CURLOPT_TIMEOUT, 5);
    curl_easy_setopt(pCurl, CURLOPT_ERRORBUFFER, curl_errtxt);
    curl_easy_setopt(pCurl, CURLOPT_WRITEFUNCTION, CBReadToStringBuf);
    curl_easy_setopt(pCurl, CURLOPT_WRITEDATA, &readBuf);
    curl_easy_setopt(pCurl, CURLOPT_USERAGENT, HTTP_USER_AGENT);
    curl_easy_setopt(pCurl, CURLOPT_URL, "https://api.ipify.org/");
    curl_easy_setopt(pCurl, CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);

    // Perform the CURL call to read from the URL
    const CURLcode cc = curl_easy_perform(pCurl);
    if (cc == CURLE_OK) {
        // CURL was OK, now check HTTP response code
        long httpResponse = 0;
        curl_easy_getinfo(pCurl, CURLINFO_RESPONSE_CODE, &httpResponse);
        // Not HTTP_OK?
        if (httpResponse != HTTP_OK) {
            LOG_MSG(logERR, "HTPP response was not OK but %d", (int)httpResponse);
            readBuf.clear();
        }

    } else {
        LOG_MSG(logERR, "CURL call failed (%d)", (int)cc);
        readBuf.clear();
    }
    
    // cleanup CURL handle
    curl_easy_cleanup(pCurl);
    
    // return what we've read
    return readBuf;
}